

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O0

void __thiscall CVmWeakRefable::~CVmWeakRefable(CVmWeakRefable *this)

{
  CVmWeakRefable *in_RDI;
  
  ~CVmWeakRefable(in_RDI);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

CVmWeakRefable::~CVmWeakRefable()
{
    /* done with our mutex */
    mu->release_ref();

    /* if we have a weak ref object, release it */
    if (weakref != 0)
        weakref->release_ref();
}